

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gain_interpolator.hpp
# Opt level: O3

size_t __thiscall
ear::dsp::GainInterpolator<ear::dsp::LinearInterpVector>::find_block
          (GainInterpolator<ear::dsp::LinearInterpVector> *this,SampleIndex sample_idx)

{
  pointer ppVar1;
  ulong uVar2;
  invalid_argument *this_00;
  ulong uVar3;
  int iVar4;
  int iVar5;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  uVar2 = this->last_block;
  ppVar1 = (this->interp_points).
           super__Vector_base<std::pair<long,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<long,_std::vector<float,_std::allocator<float>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar3 = (long)(this->interp_points).
                super__Vector_base<std::pair<long,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<long,_std::vector<float,_std::allocator<float>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1 >> 5;
  if (uVar3 < uVar2) {
    this->last_block = 0;
LAB_0011a78e:
    uVar2 = 0;
  }
  else {
    if (uVar2 == 0) goto LAB_0011a78e;
    iVar4 = -1;
    if (sample_idx < ppVar1[uVar2 - 1].first) goto LAB_0011a7b0;
  }
  if (uVar3 <= uVar2) {
    return uVar2;
  }
  iVar4 = 1;
  if (sample_idx < ppVar1[uVar2].first) {
    return uVar2;
  }
LAB_0011a7b0:
  uVar2 = uVar2 + (long)iVar4;
  while (((uVar2 != 0 && (iVar5 = -1, sample_idx < ppVar1[uVar2 - 1].first)) ||
         ((uVar2 < uVar3 && (iVar5 = 1, ppVar1[uVar2].first <= sample_idx))))) {
    uVar2 = uVar2 + (long)iVar5;
    if (iVar5 != iVar4) {
      this->last_block = uVar2;
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      local_40[0] = local_30;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_40,"interpolation points are not sorted","");
      std::invalid_argument::invalid_argument(this_00,(string *)local_40);
      *(undefined ***)this_00 = &PTR__invalid_argument_00197b50;
      __cxa_throw(this_00,&invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  this->last_block = uVar2;
  return uVar2;
}

Assistant:

size_t find_block(SampleIndex sample_idx) {
        // last_block could be outside the allowed range if interp_points
        // changed since the last call
        if (last_block > interp_points.size()) last_block = 0;

        // move in the direction given by block_cmp until we find the right
        // block (cmp == 0); this is slightly complicated by checking that we
        // are making progress.
        int cmp = block_cmp(last_block, sample_idx);
        int first_cmp = cmp;
        while (cmp != 0) {
          last_block += cmp;
          if (cmp != first_cmp)
            throw invalid_argument("interpolation points are not sorted");
          cmp = block_cmp(last_block, sample_idx);
        }

        return last_block;
      }